

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O2

time_t __thiscall QFileSystemModelPrivate::time(QFileSystemModelPrivate *this,time_t *__timer)

{
  bool bVar1;
  QFileSystemNode *tz;
  QModelIndex *in_RDX;
  long in_FS_OFFSET;
  Data local_40;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QModelIndex::isValid(in_RDX);
  if (bVar1) {
    QLocale::system();
    tz = node((QFileSystemModelPrivate *)__timer,in_RDX);
    local_40 = (Data)0x1;
    QFileSystemNode::lastModified((QFileSystemNode *)local_38,(QTimeZone *)tz);
    QLocale::toString((QDateTime *)this,(FormatType)(QLocale *)(local_38 + 8));
    QDateTime::~QDateTime((QDateTime *)local_38);
    QTimeZone::~QTimeZone((QTimeZone *)&local_40.s);
    QLocale::~QLocale((QLocale *)(local_38 + 8));
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return (time_t)this;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    *(undefined8 *)this = 0;
    *(undefined8 *)&this->field_0x8 = 0;
    *(undefined8 *)&this->field_0x10 = 0;
    return (time_t)this;
  }
  __stack_chk_fail();
}

Assistant:

QString QFileSystemModelPrivate::time(const QModelIndex &index) const
{
    if (!index.isValid())
        return QString();
#if QT_CONFIG(datestring)
    return QLocale::system().toString(node(index)->lastModified(QTimeZone::LocalTime), QLocale::ShortFormat);
#else
    Q_UNUSED(index);
    return QString();
#endif
}